

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_flow_sl(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this,size_t node,size_t ilevel)

{
  size_t *psVar1;
  ulong uVar2;
  code *pcVar3;
  char cVar4;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location LVar5;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  long lVar6;
  bool bVar7;
  bool bVar8;
  error_flags eVar9;
  int __fd;
  ulong uVar10;
  csubstr *pcVar11;
  size_t sVar12;
  NodeScalar *pNVar13;
  NodeData *pNVar14;
  Tree *pTVar15;
  Tree *pTVar16;
  long lVar17;
  char msg [37];
  char local_a8 [48];
  long local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pTVar15 = this->m_tree;
  local_70 = ilevel;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  lVar17 = node * 0x90;
  if ((~(int)pTVar15->m_buf[node].m_type.type & 0x28U) == 0) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x39;
    local_a8[9] = 'X';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x58c7) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x58c7) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: !m_tree->is_stream(node)",0x26,loc_00);
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  if ((pTVar15->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    pTVar15 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
    }
    if ((pTVar15->m_buf[node].m_type.type & DOC) == NOTYPE) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x38;
      local_a8[9] = 'X';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_03.super_LineCol.col = 0;
      loc_03.super_LineCol.offset = SUB168(ZEXT816(0x58c8) << 0x40,0);
      loc_03.super_LineCol.line = SUB168(ZEXT816(0x58c8) << 0x40,8);
      loc_03.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_03.name.len = 0x65;
      error("check failed: m_tree->is_container(node) || m_tree->is_doc(node)",0x40,loc_03);
    }
  }
  bVar7 = Tree::is_root(this->m_tree,node);
  local_78 = lVar17;
  if (!bVar7) {
    pTVar15 = this->m_tree;
    bVar7 = Tree::has_parent(pTVar15,node);
    if (!bVar7) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x15;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_04.super_LineCol.col = 0;
      loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4beb) << 0x40,0);
      loc_04.super_LineCol.line = SUB168(ZEXT816(0x4beb) << 0x40,8);
      loc_04.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_04.name.len = 0x65;
      error("check failed: has_parent(node)",0x1e,loc_04);
    }
    uVar10 = pTVar15->m_cap;
    if (node == 0xffffffffffffffff || uVar10 <= node) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
      uVar10 = pTVar15->m_cap;
    }
    pNVar14 = pTVar15->m_buf;
    uVar2 = pNVar14[node].m_parent;
    if ((uVar2 == 0xffffffffffffffff) || (uVar10 <= uVar2)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_06.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
      pNVar14 = pTVar15->m_buf;
    }
    lVar17 = local_78;
    if ((pNVar14[uVar2].m_type.type & MAP) == NOTYPE) {
      pTVar15 = this->m_tree;
      bVar7 = Tree::has_parent(pTVar15,node);
      if (!bVar7) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x16;
        local_a8[9] = 'K';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -0x36;
        local_a8[0x19] = '~';
        local_a8[0x1a] = '\x1f';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0x20] = 'e';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        loc_07.super_LineCol.col = 0;
        loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4bea) << 0x40,0);
        loc_07.super_LineCol.line = SUB168(ZEXT816(0x4bea) << 0x40,8);
        loc_07.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_07.name.len = 0x65;
        error("check failed: has_parent(node)",0x1e,loc_07);
      }
      uVar10 = pTVar15->m_cap;
      if (node == 0xffffffffffffffff || uVar10 <= node) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x7a;
        local_a8[9] = 'K';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -0x36;
        local_a8[0x19] = '~';
        local_a8[0x1a] = '\x1f';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0x20] = 'e';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        loc_08.super_LineCol.col = 0;
        loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_08.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_08.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
        uVar10 = pTVar15->m_cap;
      }
      pNVar14 = pTVar15->m_buf;
      uVar2 = *(ulong *)((long)&pNVar14->m_parent + lVar17);
      if ((uVar2 == 0xffffffffffffffff) || (uVar10 <= uVar2)) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x7a;
        local_a8[9] = 'K';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -0x36;
        local_a8[0x19] = '~';
        local_a8[0x1a] = '\x1f';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0x20] = 'e';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        loc_09.super_LineCol.col = 0;
        loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_09.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_09.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
        pNVar14 = pTVar15->m_buf;
      }
      lVar17 = local_78;
      if ((pNVar14[uVar2].m_type.type & SEQ) == NOTYPE) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x37;
        local_a8[9] = 'X';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -0x36;
        local_a8[0x19] = '~';
        local_a8[0x1a] = '\x1f';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0x20] = 'e';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        loc_10.super_LineCol.col = 0;
        loc_10.super_LineCol.offset = SUB168(ZEXT816(0x58c9) << 0x40,0);
        loc_10.super_LineCol.line = SUB168(ZEXT816(0x58c9) << 0x40,8);
        loc_10.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_10.name.len = 0x65;
        error("check failed: m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node))"
              ,99,loc_10);
      }
    }
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_11.super_LineCol.col = 0;
    loc_11.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_11.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_11.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_11.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_11);
  }
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar17) & 0x10) != 0) {
    _write_doc(this,node);
    bVar7 = Tree::has_children(this->m_tree,node);
    if (!bVar7) {
      return;
    }
    goto LAB_0018b292;
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_12.super_LineCol.col = 0;
    loc_12.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_12.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_12.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_12.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_12);
  }
  lVar6 = local_78;
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar17) & 0x2c) == 0) goto LAB_0018b292;
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_13.super_LineCol.col = 0;
    loc_13.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_13.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_13.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_13.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_13);
  }
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar6) & 4) == 0) {
    pTVar15 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_14.super_LineCol.col = 0;
      loc_14.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_14.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_14.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_14.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_14);
    }
    if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar6) & 8) == 0) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x2d;
      local_a8[9] = 'X';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_15.super_LineCol.col = 0;
      loc_15.super_LineCol.offset = SUB168(ZEXT816(0x58d3) << 0x40,0);
      loc_15.super_LineCol.line = SUB168(ZEXT816(0x58d3) << 0x40,8);
      loc_15.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_15.name.len = 0x65;
      error("check failed: m_tree->is_map(node) || m_tree->is_seq(node)",0x3a,loc_15);
    }
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar16 = pTVar15, pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_16.super_LineCol.col = 0;
    loc_16.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_16.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_16.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_16.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_16);
    pTVar16 = this->m_tree;
  }
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + local_78) & 2) == 0) {
    bVar7 = false;
    lVar17 = local_78;
  }
  else {
    pNVar13 = Tree::keysc(pTVar16,node);
    pTVar15 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_17.super_LineCol.col = 0;
      loc_17.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_17.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_17.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_17.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_17);
    }
    lVar17 = local_78;
    _write(this,(int)pNVar13,
           (void *)(ulong)((uint)*(undefined8 *)((long)&(pTVar15->m_buf->m_type).type + local_78) &
                          0x2aa2142),local_70);
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    pTVar16 = this->m_tree;
    bVar7 = true;
  }
  if ((node == 0xffffffffffffffff) || (pTVar16->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_18.super_LineCol.col = 0;
    loc_18.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_18.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_18.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_18.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_18);
  }
  uVar10 = *(ulong *)((long)&(pTVar16->m_buf->m_type).type + lVar17);
  if ((uVar10 & 0xd) != 0 && ((uint)uVar10 >> 0xb & 1) != 0) {
    if (bVar7) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    pcVar11 = Tree::val_tag(this->m_tree,node);
    _write_tag(this,*pcVar11);
    bVar7 = true;
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_19.super_LineCol.col = 0;
    loc_19.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_19.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_19.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_19.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_19);
  }
  uVar10 = *(ulong *)((long)&(pTVar15->m_buf->m_type).type + lVar17);
  if ((uVar10 & 0xd) == 0 || ((uint)uVar10 >> 9 & 1) == 0) {
    if (bVar7) goto LAB_0018b09f;
  }
  else {
    if (bVar7) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
    pcVar11 = Tree::val_anchor(this->m_tree,node);
    sVar12 = pcVar11->len;
    if (pcVar11->str != (char *)0x0 && sVar12 != 0) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)pcVar11->str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + sVar12;
    }
LAB_0018b09f:
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  pTVar15 = this->m_tree;
  if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_20.super_LineCol.col = 0;
    loc_20.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_20.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_20.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_20.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_20);
  }
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar17) & 4) == 0) {
    pTVar15 = this->m_tree;
    if ((node == 0xffffffffffffffff) || (pTVar15->m_cap <= node)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_21.super_LineCol.col = 0;
      loc_21.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_21.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_21.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_21.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_21);
    }
    if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + lVar17) & 8) == 0) {
      builtin_strncpy(local_a8,"check failed: (m_tree->is_seq(node))",0x25);
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_58 = 0;
      uStack_50 = 0x58f8;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x58f8) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x58f8) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_a8,0x25,LVar5,(this->m_tree->m_callbacks).m_user_data);
    }
    cVar4 = (char)(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_stream;
  }
  else {
    cVar4 = (char)(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_stream;
  }
  std::ostream::put(cVar4 + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
LAB_0018b292:
  local_68 = node;
  sVar12 = Tree::first_child(this->m_tree,node);
  if (sVar12 != 0xffffffffffffffff) {
    local_60 = local_70 + 1;
    lVar17 = 0;
    do {
      bVar7 = lVar17 != 0;
      lVar17 = lVar17 + -1;
      if (bVar7) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      pTVar15 = this->m_tree;
      if (pTVar15->m_cap <= sVar12) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = -0x7a;
        local_a8[9] = 'K';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = -0x36;
        local_a8[0x19] = '~';
        local_a8[0x1a] = '\x1f';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0x20] = 'e';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        loc_22.super_LineCol.col = 0;
        loc_22.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
        loc_22.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
        loc_22.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        loc_22.name.len = 0x65;
        error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_22);
      }
      pTVar16 = this->m_tree;
      if ((~(int)pTVar15->m_buf[sVar12].m_type.type & 3U) == 0) {
        pNVar13 = Tree::keysc(pTVar16,sVar12);
        pTVar15 = this->m_tree;
        if (pTVar15->m_cap <= sVar12) {
          eVar9 = get_error_flags();
          if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = -0x7a;
          local_a8[9] = 'K';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = -0x36;
          local_a8[0x19] = '~';
          local_a8[0x1a] = '\x1f';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0x20] = 'e';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          loc_23.super_LineCol.col = 0;
          loc_23.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_23.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_23.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc_23.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_23);
        }
        _write(this,(int)pNVar13,
               (void *)(ulong)((uint)pTVar15->m_buf[sVar12].m_type.type & 0x2aa2142),local_70);
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),0x1f8e3f);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 2;
        pNVar13 = Tree::valsc(this->m_tree,sVar12);
        __fd = (int)pNVar13;
        pTVar15 = this->m_tree;
        if (pTVar15->m_cap <= sVar12) {
          eVar9 = get_error_flags();
          if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
LAB_0018b50d:
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = -0x7a;
          local_a8[9] = 'K';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = -0x36;
          local_a8[0x19] = '~';
          local_a8[0x1a] = '\x1f';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0x20] = 'e';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          loc_25.super_LineCol.col = 0;
          loc_25.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_25.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_25.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc_25.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_25);
        }
LAB_0018b561:
        _write(this,__fd,(void *)(ulong)((uint)pTVar15->m_buf[sVar12].m_type.type & 0x5541281),
               local_70);
      }
      else {
        if (pTVar16->m_cap <= sVar12) {
          eVar9 = get_error_flags();
          if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_a8[0] = '\0';
          local_a8[1] = '\0';
          local_a8[2] = '\0';
          local_a8[3] = '\0';
          local_a8[4] = '\0';
          local_a8[5] = '\0';
          local_a8[6] = '\0';
          local_a8[7] = '\0';
          local_a8[8] = -0x7a;
          local_a8[9] = 'K';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x10] = '\0';
          local_a8[0x11] = '\0';
          local_a8[0x12] = '\0';
          local_a8[0x13] = '\0';
          local_a8[0x14] = '\0';
          local_a8[0x15] = '\0';
          local_a8[0x16] = '\0';
          local_a8[0x17] = '\0';
          local_a8[0x18] = -0x36;
          local_a8[0x19] = '~';
          local_a8[0x1a] = '\x1f';
          local_a8[0x1b] = '\0';
          local_a8[0x1c] = '\0';
          local_a8[0x1d] = '\0';
          local_a8[0x1e] = '\0';
          local_a8[0x1f] = '\0';
          local_a8[0x20] = 'e';
          local_a8[0x21] = '\0';
          local_a8[0x22] = '\0';
          local_a8[0x23] = '\0';
          local_a8[0x24] = '\0';
          local_a8[0x25] = '\0';
          local_a8[0x26] = '\0';
          local_a8[0x27] = '\0';
          loc_24.super_LineCol.col = 0;
          loc_24.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_24.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_24.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          loc_24.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_24);
        }
        if ((pTVar16->m_buf[sVar12].m_type.type & KEYVAL) == VAL) {
          pNVar13 = Tree::valsc(this->m_tree,sVar12);
          __fd = (int)pNVar13;
          pTVar15 = this->m_tree;
          if (pTVar15->m_cap <= sVar12) {
            eVar9 = get_error_flags();
            if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            goto LAB_0018b50d;
          }
          goto LAB_0018b561;
        }
        _do_visit_flow_sl(this,sVar12,local_60);
      }
      sVar12 = Tree::next_sibling(this->m_tree,sVar12);
    } while (sVar12 != 0xffffffffffffffff);
  }
  sVar12 = local_68;
  pTVar15 = this->m_tree;
  if ((local_68 == 0xffffffffffffffff) || (pTVar15->m_cap <= local_68)) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = -0x7a;
    local_a8[9] = 'K';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = -0x36;
    local_a8[0x19] = '~';
    local_a8[0x1a] = '\x1f';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0x20] = 'e';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    loc_26.super_LineCol.col = 0;
    loc_26.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_26.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_26.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_26.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_26);
  }
  if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + local_78) & 4) == 0) {
    pTVar15 = this->m_tree;
    if ((sVar12 == 0xffffffffffffffff) || (pTVar15->m_cap <= sVar12)) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = -0x7a;
      local_a8[9] = 'K';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = -0x36;
      local_a8[0x19] = '~';
      local_a8[0x1a] = '\x1f';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0x20] = 'e';
      local_a8[0x21] = '\0';
      local_a8[0x22] = '\0';
      local_a8[0x23] = '\0';
      local_a8[0x24] = '\0';
      local_a8[0x25] = '\0';
      local_a8[0x26] = '\0';
      local_a8[0x27] = '\0';
      loc_27.super_LineCol.col = 0;
      loc_27.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_27.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_27.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_27.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_27);
    }
    if ((*(byte *)((long)&(pTVar15->m_buf->m_type).type + local_78) & 8) == 0) {
      return;
    }
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_flow_sl(size_t node, size_t ilevel)
{
    RYML_ASSERT(!m_tree->is_stream(node));
    RYML_ASSERT(m_tree->is_container(node) || m_tree->is_doc(node));
    RYML_ASSERT(m_tree->is_root(node) || (m_tree->parent_is_map(node) || m_tree->parent_is_seq(node)));

    if(m_tree->is_doc(node))
    {
        _write_doc(node);
        if(!m_tree->has_children(node))
            return;
    }
    else if(m_tree->is_container(node))
    {
        RYML_ASSERT(m_tree->is_map(node) || m_tree->is_seq(node));

        bool spc = false; // write a space

        if(m_tree->has_key(node))
        {
            _writek(node, ilevel);
            this->Writer::_do_write(':');
            spc = true;
        }

        if(m_tree->has_val_tag(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(node));
            spc = true;
        }

        if(m_tree->has_val_anchor(node))
        {
            if(spc)
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(node));
            spc = true;
        }

        if(spc)
            this->Writer::_do_write(' ');

        if(m_tree->is_map(node))
        {
            this->Writer::_do_write('{');
        }
        else
        {
            _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_seq(node));
            this->Writer::_do_write('[');
        }
    } // container

    for(size_t child = m_tree->first_child(node), count = 0; child != NONE; child = m_tree->next_sibling(child))
    {
        if(count++)
            this->Writer::_do_write(',');
        if(m_tree->is_keyval(child))
        {
            _writek(child, ilevel);
            this->Writer::_do_write(": ");
            _writev(child, ilevel);
        }
        else if(m_tree->is_val(child))
        {
            _writev(child, ilevel);
        }
        else
        {
            // with single-line flow, we can never go back to block
            _do_visit_flow_sl(child, ilevel + 1);
        }
    }

    if(m_tree->is_map(node))
    {
        this->Writer::_do_write('}');
    }
    else if(m_tree->is_seq(node))
    {
        this->Writer::_do_write(']');
    }
}